

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O0

roaring_bitmap_t * lazy_or_from_lazy_inputs(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  container_t *c1_00;
  container_t *pcVar1;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c2_1;
  container_t *c1_1;
  container_t *c;
  container_t *c2;
  container_t *c1;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  roaring_bitmap_t *answer;
  uint32_t neededcap;
  int length2;
  int length1;
  uint8_t result_type;
  uint16_t in_stack_ffffffffffffff8e;
  int32_t in_stack_ffffffffffffff90;
  int32_t start_index;
  roaring_array_t *in_stack_ffffffffffffff98;
  roaring_array_t *in_stack_ffffffffffffffa0;
  uint8_t type2_00;
  container_t *in_stack_ffffffffffffffa8;
  uint8_t type1_00;
  ushort local_3e;
  ushort local_3c;
  uint8_t local_3a;
  uint8_t local_39;
  int local_38;
  int local_34;
  roaring_array_t *local_30;
  int32_t local_28;
  int32_t local_24;
  int local_20;
  undefined1 local_19;
  roaring_array_t *local_18;
  roaring_array_t *local_10;
  roaring_array_t *local_8;
  
  local_19 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = ra_get_size(in_RDI);
  local_24 = ra_get_size(local_18);
  if (local_20 == 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x16b291);
    local_8 = local_18;
  }
  else if (local_24 == 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x16b2b2);
    local_8 = local_10;
  }
  else {
    start_index = local_20;
    if (local_24 < local_20) {
      start_index = local_24;
    }
    local_28 = start_index;
    local_30 = &roaring_bitmap_create_with_capacity
                          ((uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20))->high_low_container
    ;
    local_34 = 0;
    local_38 = 0;
    local_3c = ra_get_key_at_index(local_10,0);
    local_3e = ra_get_key_at_index(local_18,(uint16_t)local_38);
    while( true ) {
      while (local_3c != local_3e) {
        if (local_3c < local_3e) {
          in_stack_ffffffffffffffa0 =
               (roaring_array_t *)ra_get_container_at_index(local_10,(uint16_t)local_34,&local_39);
          ra_append(in_stack_ffffffffffffffa0,(uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30),
                    (container_t *)CONCAT44(start_index,in_stack_ffffffffffffff90),
                    (uint8_t)(in_stack_ffffffffffffff8e >> 8));
          local_34 = local_34 + 1;
          if (local_34 == local_20) goto LAB_0016b5b2;
          local_3c = ra_get_key_at_index(local_10,(uint16_t)local_34);
        }
        else {
          in_stack_ffffffffffffff98 =
               (roaring_array_t *)ra_get_container_at_index(local_18,(uint16_t)local_38,&local_3a);
          ra_append(in_stack_ffffffffffffffa0,(uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30),
                    (container_t *)CONCAT44(start_index,in_stack_ffffffffffffff90),
                    (uint8_t)(in_stack_ffffffffffffff8e >> 8));
          local_38 = local_38 + 1;
          if (local_38 == local_24) goto LAB_0016b5b2;
          local_3e = ra_get_key_at_index(local_18,(uint16_t)local_38);
        }
      }
      ra_unshare_container_at_index
                ((roaring_array_t *)CONCAT44(start_index,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8e);
      c1_00 = ra_get_container_at_index(local_10,(uint16_t)local_34,&local_39);
      ra_unshare_container_at_index
                ((roaring_array_t *)CONCAT44(start_index,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8e);
      pcVar1 = ra_get_container_at_index(local_18,(uint16_t)local_38,&local_3a);
      type2_00 = (uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
      type1_00 = (uint8_t)((ulong)pcVar1 >> 0x38);
      if ((local_3a == '\x01') && (local_39 != '\x01')) {
        in_stack_ffffffffffffffa8 =
             container_lazy_ior(c1_00,type1_00,in_stack_ffffffffffffffa8,type2_00,
                                (uint8_t *)in_stack_ffffffffffffff98);
        container_free((container_t *)CONCAT44(start_index,in_stack_ffffffffffffff90),
                       (uint8_t)(in_stack_ffffffffffffff8e >> 8));
        if (in_stack_ffffffffffffffa8 != pcVar1) {
          container_free((container_t *)CONCAT44(start_index,in_stack_ffffffffffffff90),
                         (uint8_t)(in_stack_ffffffffffffff8e >> 8));
        }
      }
      else {
        in_stack_ffffffffffffffa8 =
             container_lazy_ior(c1_00,type1_00,in_stack_ffffffffffffffa8,type2_00,
                                (uint8_t *)in_stack_ffffffffffffff98);
        container_free((container_t *)CONCAT44(start_index,in_stack_ffffffffffffff90),
                       (uint8_t)(in_stack_ffffffffffffff8e >> 8));
        if (in_stack_ffffffffffffffa8 != c1_00) {
          container_free((container_t *)CONCAT44(start_index,in_stack_ffffffffffffff90),
                         (uint8_t)(in_stack_ffffffffffffff8e >> 8));
        }
      }
      ra_append(in_stack_ffffffffffffffa0,(uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30),
                (container_t *)CONCAT44(start_index,in_stack_ffffffffffffff90),
                (uint8_t)(in_stack_ffffffffffffff8e >> 8));
      local_34 = local_34 + 1;
      local_38 = local_38 + 1;
      if ((local_34 == local_20) || (local_38 == local_24)) break;
      local_3c = ra_get_key_at_index(local_10,(uint16_t)local_34);
      local_3e = ra_get_key_at_index(local_18,(uint16_t)local_38);
    }
LAB_0016b5b2:
    if (local_34 == local_20) {
      ra_append_move_range
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,start_index,
                 in_stack_ffffffffffffff90);
    }
    else if (local_38 == local_24) {
      ra_append_move_range
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,start_index,
                 in_stack_ffffffffffffff90);
    }
    ra_clear_without_containers((roaring_array_t *)0x16b602);
    ra_clear_without_containers((roaring_array_t *)0x16b60c);
    roaring_free((void *)0x16b616);
    roaring_free((void *)0x16b620);
    local_8 = local_30;
  }
  return (roaring_bitmap_t *)local_8;
}

Assistant:

static roaring_bitmap_t *lazy_or_from_lazy_inputs(roaring_bitmap_t *x1,
                                                  roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = ra_get_size(&x1->high_low_container),
              length2 = ra_get_size(&x2->high_low_container);
    if (0 == length1) {
        roaring_bitmap_free(x1);
        return x2;
    }
    if (0 == length2) {
        roaring_bitmap_free(x2);
        return x1;
    }
    uint32_t neededcap = length1 > length2 ? length2 : length1;
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(neededcap);
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            // todo: unsharing can be inefficient as it may create a clone where
            // none
            // is needed, but it has the benefit of being easy to reason about.

            ra_unshare_container_at_index(&x1->high_low_container,
                                          (uint16_t)pos1);
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            assert(type1 != SHARED_CONTAINER_TYPE);

            ra_unshare_container_at_index(&x2->high_low_container,
                                          (uint16_t)pos2);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            assert(type2 != SHARED_CONTAINER_TYPE);

            container_t *c;

            if ((type2 == BITSET_CONTAINER_TYPE) &&
                (type1 != BITSET_CONTAINER_TYPE)) {
                c = container_lazy_ior(c2, type2, c1, type1, &result_type);
                container_free(c1, type1);
                if (c != c2) {
                    container_free(c2, type2);
                }
            } else {
                c = container_lazy_ior(c1, type1, c2, type2, &result_type);
                container_free(c2, type2);
                if (c != c1) {
                    container_free(c1, type1);
                }
            }
            // since we assume that the initial containers are non-empty, the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_move_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2);
    } else if (pos2 == length2) {
        ra_append_move_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1);
    }
    ra_clear_without_containers(&x1->high_low_container);
    ra_clear_without_containers(&x2->high_low_container);
    roaring_free(x1);
    roaring_free(x2);
    return answer;
}